

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O2

bool __thiscall
Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
          (Set<Kernel::TermList,_Lib::DefaultHash> *this,TermList val)

{
  uint uVar1;
  ulong uVar2;
  Cell *pCVar3;
  TermList val_local;
  
  val_local = val;
  uVar1 = Kernel::TermList::defaultHash(&val_local);
  uVar2 = 2;
  if (2 < uVar1) {
    uVar2 = (ulong)uVar1;
  }
  pCVar3 = this->_entries + uVar2 % (ulong)(uint)this->_capacity;
  while ((uVar1 = pCVar3->code, uVar1 != 0 &&
         ((uVar1 != (uint)uVar2 || ((pCVar3->value)._content != val_local._content))))) {
    pCVar3 = pCVar3 + 1;
    if (pCVar3 == this->_afterLast) {
      pCVar3 = this->_entries;
    }
  }
  return uVar1 != 0;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }